

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O0

void __thiscall
PreciseMeasurement_unaryOps_Test::~PreciseMeasurement_unaryOps_Test
          (PreciseMeasurement_unaryOps_Test *this)

{
  PreciseMeasurement_unaryOps_Test *this_local;
  
  ~PreciseMeasurement_unaryOps_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(PreciseMeasurement, unaryOps)
{
    precise_measurement x(2.0, precise::cm);

    auto z = -x;
    auto y = +x;
    EXPECT_EQ(y, x);
    EXPECT_EQ(z.value(), -x.value());
    EXPECT_EQ(z.units(), x.units());
}